

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cOHz.cpp
# Opt level: O3

Vector<double,_4U> * __thiscall
OpenMD::COHZ::calcCorrVal
          (Vector<double,_4U> *__return_storage_ptr__,COHZ *this,int frame1,int frame2,int id1,
          int id2)

{
  pointer pvVar1;
  double dVar2;
  long lVar3;
  uint i;
  long lVar4;
  long lVar5;
  DoublePolynomial *this_00;
  double tmp_1;
  double tmp;
  double dVar6;
  double dVar7;
  Vector<double,_3U> result;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result_13;
  Vector<double,_3U> result_12;
  Vector<double,_3U> result_11;
  Vector<double,_3U> result_8;
  Vector<double,_3U> result_5;
  Vector<double,_3U> result_2;
  Vector3d v2y;
  Vector3d v1y;
  double local_188 [4];
  double local_168 [4];
  double local_148 [4];
  double local_128 [4];
  double local_108 [4];
  double local_e8 [4];
  double local_c8 [4];
  double local_a8 [4];
  double local_88 [4];
  double local_68 [4];
  double local_48 [4];
  double local_28 [3];
  
  pvVar1 = (this->rotMats_).
           super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)id1 * 0x48 +
          *(long *)&pvVar1[frame1].
                    super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                    ._M_impl.super__Vector_impl_data;
  lVar4 = (ulong)(uint)this->yaxis_ * 0x18;
  local_28[2] = (double)*(undefined8 *)(lVar5 + 0x10 + lVar4);
  local_28[0] = *(double *)(lVar5 + lVar4);
  local_28[1] = ((double *)(lVar5 + lVar4))[1];
  lVar3 = (ulong)(uint)this->axis_ * 0x18;
  local_128[2] = (double)*(undefined8 *)(lVar5 + 0x10 + lVar3);
  local_128[0] = *(double *)(lVar5 + lVar3);
  local_128[1] = ((double *)(lVar5 + lVar3))[1];
  lVar5 = (long)id2 * 0x48 +
          *(long *)&pvVar1[frame2].
                    super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                    ._M_impl.super__Vector_impl_data;
  local_48[2] = (double)*(undefined8 *)(lVar5 + 0x10 + lVar4);
  local_48[0] = *(double *)(lVar5 + lVar4);
  local_48[1] = ((double *)(lVar5 + lVar4))[1];
  local_148[2] = (double)*(undefined8 *)(lVar5 + 0x10 + lVar3);
  local_148[0] = *(double *)(lVar5 + lVar3);
  local_148[1] = ((double *)(lVar5 + lVar3))[1];
  local_188[0] = 0.0;
  local_188[1] = 0.0;
  local_188[2] = 0.0;
  lVar4 = 0;
  do {
    local_188[lVar4] = local_28[lVar4] * 0.81649;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  local_168[2] = 0.0;
  lVar4 = 0;
  do {
    local_168[lVar4] = local_128[lVar4] * 0.57736;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  lVar4 = 0;
  do {
    local_68[lVar4] = local_188[lVar4] + local_168[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_188[0] = 0.0;
  local_188[1] = 0.0;
  local_188[2] = 0.0;
  lVar4 = 0;
  do {
    local_188[lVar4] = local_48[lVar4] * 0.81649;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  local_168[2] = 0.0;
  lVar4 = 0;
  do {
    local_168[lVar4] = local_148[lVar4] * 0.57736;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  lVar4 = 0;
  do {
    local_88[lVar4] = local_188[lVar4] + local_168[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_188[0] = 0.0;
  local_188[1] = 0.0;
  local_188[2] = 0.0;
  lVar4 = 0;
  do {
    local_188[lVar4] = local_28[lVar4] * -0.81649;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  local_168[2] = 0.0;
  lVar4 = 0;
  do {
    local_168[lVar4] = local_128[lVar4] * 0.57736;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  lVar4 = 0;
  do {
    local_a8[lVar4] = local_188[lVar4] + local_168[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_188[0] = 0.0;
  local_188[1] = 0.0;
  local_188[2] = 0.0;
  lVar4 = 0;
  do {
    local_188[lVar4] = local_48[lVar4] * -0.81649;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  local_168[2] = 0.0;
  lVar4 = 0;
  do {
    local_168[lVar4] = local_148[lVar4] * 0.57736;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c8[2] = 0.0;
  lVar4 = 0;
  do {
    local_c8[lVar4] = local_188[lVar4] + local_168[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_e8[2] = 0.0;
  lVar4 = 0;
  do {
    local_e8[lVar4] = local_28[lVar4] * 1.63298;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_108[0] = 0.0;
  local_108[1] = 0.0;
  local_108[2] = 0.0;
  lVar4 = 0;
  do {
    local_108[lVar4] = local_48[lVar4] * 1.63298;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  __return_storage_ptr__->data_[3] = 0.0;
  dVar6 = 0.0;
  lVar4 = 0;
  do {
    dVar6 = dVar6 + local_128[lVar4] * local_148[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  dVar2 = 0.0;
  lVar4 = 0;
  do {
    dVar2 = dVar2 + local_128[lVar4] * local_128[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar7 = 0.0;
  lVar4 = 0;
  do {
    dVar7 = dVar7 + local_148[lVar4] * local_148[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  this_00 = &this->legendre_;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  local_188[0] = dVar6 / (dVar2 * dVar7);
  dVar6 = Polynomial<double>::evaluate(this_00,local_188);
  __return_storage_ptr__->data_[0] = dVar6;
  lVar4 = 0;
  dVar6 = 0.0;
  do {
    dVar6 = dVar6 + local_68[lVar4] * local_88[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  dVar2 = 0.0;
  lVar4 = 0;
  do {
    dVar2 = dVar2 + local_68[lVar4] * local_68[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar7 = 0.0;
  lVar4 = 0;
  do {
    dVar7 = dVar7 + local_88[lVar4] * local_88[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  local_188[0] = dVar6 / (dVar2 * dVar7);
  dVar6 = Polynomial<double>::evaluate(this_00,local_188);
  __return_storage_ptr__->data_[1] = dVar6;
  lVar4 = 0;
  dVar6 = 0.0;
  do {
    dVar6 = dVar6 + local_a8[lVar4] * local_c8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  dVar2 = 0.0;
  lVar4 = 0;
  do {
    dVar2 = dVar2 + local_a8[lVar4] * local_a8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar7 = 0.0;
  lVar4 = 0;
  do {
    dVar7 = dVar7 + local_c8[lVar4] * local_c8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  local_188[0] = dVar6 / (dVar2 * dVar7);
  dVar6 = Polynomial<double>::evaluate(this_00,local_188);
  __return_storage_ptr__->data_[2] = dVar6;
  lVar4 = 0;
  dVar6 = 0.0;
  do {
    dVar6 = dVar6 + local_e8[lVar4] * local_108[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  dVar2 = 0.0;
  lVar4 = 0;
  do {
    dVar2 = dVar2 + local_e8[lVar4] * local_e8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar7 = 0.0;
  lVar4 = 0;
  do {
    dVar7 = dVar7 + local_108[lVar4] * local_108[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  local_188[0] = dVar6 / (dVar2 * dVar7);
  dVar6 = Polynomial<double>::evaluate(this_00,local_188);
  __return_storage_ptr__->data_[3] = dVar6;
  return __return_storage_ptr__;
}

Assistant:

Vector<RealType, 4> COHZ::calcCorrVal(int frame1, int frame2, int id1,
                                        int id2) {
    // Vectors v1x, v1y, and v1z are the body-fixed axes on the
    // molecule in frame 1 in the laboratory frame.

    // Vectors v2x, v2y, and v2z are the body-fixed axes on the
    // molecule in frame 2 in the laboratory frame.

    // Vectors u1 & u2 are the first OH bond vector in frames 1 & 2
    // respectively.  Here we assume SPC/E geometry.

    // Vectors w1 & w2 are the second OH bond vector in frames 1 & 2
    // respectively.  Here we assume SPC/E geometry.

    // Vectors h1 & h2 are the HH bond vectors in frames 1 & 2
    // respectively.  Here we assume SPC/E geometry again.

    // Vector3d v1x = sd1->getA(frame1).getRow(0);
    // Vector3d v2x = sd2->getA(frame2).getRow(0);

    Vector3d v1y = rotMats_[frame1][id1].getRow(yaxis_);
    Vector3d v1z = rotMats_[frame1][id1].getRow(axis_);

    Vector3d v2y = rotMats_[frame2][id2].getRow(yaxis_);
    Vector3d v2z = rotMats_[frame2][id2].getRow(axis_);

    Vector3d u1 = 0.81649 * v1y + 0.57736 * v1z;
    Vector3d u2 = 0.81649 * v2y + 0.57736 * v2z;

    Vector3d w1 = -0.81649 * v1y + 0.57736 * v1z;
    Vector3d w2 = -0.81649 * v2y + 0.57736 * v2z;

    Vector3d h1 = 1.63298 * v1y;
    Vector3d h2 = 1.63298 * v2y;

    // result is a Vector<RealType, 4> with Dipole, OH1, OH2, and HH:
    Vector<RealType, 4> r(0.0);
    r[0] = legendre_.evaluate(dot(v1z, v2z) / (v1z.length() * v2z.length()));
    r[1] = legendre_.evaluate(dot(u1, u2) / (u1.length() * u2.length()));
    r[2] = legendre_.evaluate(dot(w1, w2) / (w1.length() * w2.length()));
    r[3] = legendre_.evaluate(dot(h1, h2) / (h1.length() * h2.length()));
    return r;
  }